

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O0

BCReg expr_list(LexState *ls,ExpDesc *v)

{
  int iVar1;
  FuncState *in_RSI;
  BCReg n;
  undefined4 in_stack_ffffffffffffffe8;
  BCReg BVar2;
  
  BVar2 = 1;
  expr((LexState *)in_RSI,(ExpDesc *)CONCAT44(1,in_stack_ffffffffffffffe8));
  while( true ) {
    iVar1 = lex_opt((LexState *)CONCAT44(BVar2,in_stack_ffffffffffffffe8),0);
    if (iVar1 == 0) break;
    expr_tonextreg(in_RSI,(ExpDesc *)CONCAT44(BVar2,in_stack_ffffffffffffffe8));
    expr((LexState *)in_RSI,(ExpDesc *)CONCAT44(BVar2,in_stack_ffffffffffffffe8));
    BVar2 = BVar2 + 1;
  }
  return BVar2;
}

Assistant:

static BCReg expr_list(LexState *ls, ExpDesc *v)
{
  BCReg n = 1;
  expr(ls, v);
  while (lex_opt(ls, ',')) {
    expr_tonextreg(ls->fs, v);
    expr(ls, v);
    n++;
  }
  return n;
}